

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O3

ngx_radix_node_t * ngx_radix_alloc(ngx_radix_tree_t *tree)

{
  ngx_radix_node_t *pnVar1;
  ulong uVar2;
  
  pnVar1 = tree->free;
  if (pnVar1 == (ngx_radix_node_t *)0x0) {
    if (tree->size < 0x20) {
      pnVar1 = (ngx_radix_node_t *)ngx_pmemalign(tree->pool,ngx_pagesize,ngx_pagesize);
      tree->start = (char *)pnVar1;
      uVar2 = ngx_pagesize;
      if (pnVar1 == (ngx_radix_node_t *)0x0) {
        return (ngx_radix_node_t *)0x0;
      }
    }
    else {
      pnVar1 = (ngx_radix_node_t *)tree->start;
      uVar2 = tree->size;
    }
    tree->start = (char *)(pnVar1 + 1);
    tree->size = uVar2 - 0x20;
  }
  else {
    tree->free = pnVar1->right;
  }
  return pnVar1;
}

Assistant:

static ngx_radix_node_t *
ngx_radix_alloc(ngx_radix_tree_t *tree)
{
    ngx_radix_node_t  *p;

    if (tree->free) {
        p = tree->free;
        tree->free = tree->free->right;
        return p;
    }

    if (tree->size < sizeof(ngx_radix_node_t)) {
        tree->start = ngx_pmemalign(tree->pool, ngx_pagesize, ngx_pagesize);
        if (tree->start == NULL) {
            return NULL;
        }

        tree->size = ngx_pagesize;
    }

    p = (ngx_radix_node_t *) tree->start;
    tree->start += sizeof(ngx_radix_node_t);
    tree->size -= sizeof(ngx_radix_node_t);

    return p;
}